

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_event_init__posix(ma_event *pEvent)

{
  int iVar1;
  int result;
  ma_event *pEvent_local;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)&pEvent->lock,(pthread_mutexattr_t *)0x0);
  if (iVar1 == 0) {
    iVar1 = pthread_cond_init((pthread_cond_t *)&pEvent->cond,(pthread_condattr_t *)0x0);
    if (iVar1 == 0) {
      pEvent->value = 0;
      pEvent_local._4_4_ = 0;
    }
    else {
      pthread_mutex_destroy((pthread_mutex_t *)&pEvent->lock);
      pEvent_local._4_4_ = ma_result_from_errno(iVar1);
    }
  }
  else {
    pEvent_local._4_4_ = ma_result_from_errno(iVar1);
  }
  return pEvent_local._4_4_;
}

Assistant:

static ma_result ma_event_init__posix(ma_event* pEvent)
{
    int result;

    result = pthread_mutex_init(&pEvent->lock, NULL);
    if (result != 0) {
        return ma_result_from_errno(result);
    }

    result = pthread_cond_init(&pEvent->cond, NULL);
    if (result != 0) {
        pthread_mutex_destroy(&pEvent->lock);
        return ma_result_from_errno(result);
    }

    pEvent->value = 0;
    return MA_SUCCESS;
}